

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

void base64_stream_encode_final(base64_state *state,char *out,size_t *outlen)

{
  uint8_t *o;
  size_t *outlen_local;
  char *out_local;
  base64_state *state_local;
  
  if (state->bytes == 1) {
    *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[state->carry];
    out[1] = '=';
    out[2] = '=';
    *outlen = 3;
  }
  else if (state->bytes == 2) {
    *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[state->carry];
    out[1] = '=';
    *outlen = 2;
  }
  else {
    *outlen = 0;
  }
  return;
}

Assistant:

void
base64_stream_encode_final
	( struct base64_state	*state
	, char			*out
	, size_t		*outlen
	)
{
	uint8_t *o = (uint8_t *)out;

	if (state->bytes == 1) {
		*o++ = base64_table_enc_6bit[state->carry];
		*o++ = '=';
		*o++ = '=';
		*outlen = 3;
		return;
	}
	if (state->bytes == 2) {
		*o++ = base64_table_enc_6bit[state->carry];
		*o++ = '=';
		*outlen = 2;
		return;
	}
	*outlen = 0;
}